

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrackinglinesearch.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
backtrackingLineSearch::optimize
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          backtrackingLineSearch *this)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  _func_double_vector<double,_std::allocator<double>_> *p_Var6;
  _func_vector<double,_std::allocator<double>_>_vector<double,_std::allocator<double>_> *p_Var7;
  double *pdVar8;
  vector<double,_std::allocator<double>_> vVar9;
  vector<double,_std::allocator<double>_> vVar10;
  vector<double,_std::allocator<double>_> vVar11;
  vector<double,_std::allocator<double>_> vVar12;
  vector<double,_std::allocator<double>_> vVar13;
  vector<double,_std::allocator<double>_> vVar14;
  vector<double,_std::allocator<double>_> vVar15;
  ostream *poVar16;
  uint uVar17;
  vector<double,_std::allocator<double>_> *dF;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  pointer pdVar23;
  initializer_list<double> __l;
  undefined1 in_stack_fffffffffffffe38 [16];
  vector<double,_std::allocator<double>_> delta;
  _Vector_base<double,_std::allocator<double>_> local_138;
  _Vector_base<double,_std::allocator<double>_> local_120;
  _Vector_base<double,_std::allocator<double>_> local_108;
  _Vector_base<double,_std::allocator<double>_> local_f0;
  double local_d8;
  double dStack_d0;
  _Vector_base<double,_std::allocator<double>_> local_c0;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  utils local_90 [24];
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  pdVar23 = (pointer)this->alpha;
  dVar2 = this->alpha_dec;
  dVar3 = this->alpha_inc;
  delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if ((this->super_optimizer).verbose != 0) {
    std::operator<<((ostream *)&std::cout,"Initial SOLUTION : (");
    poVar16 = std::ostream::_M_insert<double>
                        (*(this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    std::operator<<(poVar16,",");
    pvVar1 = &this->x;
    poVar16 = std::ostream::_M_insert<double>
                        ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[1]);
    poVar16 = std::operator<<(poVar16,")");
    std::endl<char,std::char_traits<char>>(poVar16);
    poVar16 = std::ostream::_M_insert<double>
                        (*(this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    std::operator<<(poVar16," ");
    poVar16 = std::ostream::_M_insert<double>
                        ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[1]);
    std::operator<<(poVar16," ");
    p_Var6 = this->f;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_f0,pvVar1);
    vVar9.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar23;
    vVar9.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)in_stack_fffffffffffffe38._0_8_;
    vVar9.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)in_stack_fffffffffffffe38._8_8_;
    dVar18 = (*p_Var6)(vVar9);
    poVar16 = std::ostream::_M_insert<double>(dVar18);
    std::endl<char,std::char_traits<char>>(poVar16);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_f0);
  }
  pvVar1 = &this->x;
  uVar17 = 0;
  while( true ) {
    if (9 < uVar17) break;
    p_Var7 = this->df;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_108,pvVar1);
    vVar10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar23;
    vVar10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)in_stack_fffffffffffffe38._0_8_;
    vVar10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)in_stack_fffffffffffffe38._8_8_;
    (*p_Var7)((vector<double,_std::allocator<double>_> *)local_90,vVar10);
    utils::Delta((vector<double,_std::allocator<double>_> *)&local_138,local_90,dF);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&delta,&local_138);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_138);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_90);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_108);
    while( true ) {
      p_Var6 = this->f;
      pdVar8 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_d8 = (double)pdVar23 *
                 *delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + *pdVar8;
      dStack_d0 = (double)pdVar23 *
                  delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1] + pdVar8[1];
      __l._M_len = 2;
      __l._M_array = &local_d8;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_48,__l,
                 (allocator_type *)&stack0xfffffffffffffe47);
      vVar11.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar23;
      vVar11.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)in_stack_fffffffffffffe38._0_8_;
      vVar11.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffe38._8_8_;
      dVar19 = (*p_Var6)(vVar11);
      p_Var6 = this->f;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_a8,pvVar1);
      vVar12.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar23;
      vVar12.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)in_stack_fffffffffffffe38._0_8_;
      vVar12.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffe38._8_8_;
      dVar20 = (*p_Var6)(vVar12);
      dVar18 = this->wolfe_para;
      p_Var7 = this->df;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_c0,pvVar1);
      vVar13.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar23;
      vVar13.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)in_stack_fffffffffffffe38._0_8_;
      vVar13.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffe38._8_8_;
      (*p_Var7)((vector<double,_std::allocator<double>_> *)&local_138,vVar13);
      dVar21 = *local_138._M_impl.super__Vector_impl_data._M_start * (double)pdVar23;
      dVar4 = *delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      p_Var7 = this->df;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_78,pvVar1);
      vVar14.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar23;
      vVar14.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)in_stack_fffffffffffffe38._0_8_;
      vVar14.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffe38._8_8_;
      (*p_Var7)((vector<double,_std::allocator<double>_> *)&local_60,vVar14);
      dVar22 = local_60._M_impl.super__Vector_impl_data._M_start[1] * (double)pdVar23;
      dVar5 = delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[1];
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_138);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c0);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
      if (dVar19 <= dVar18 * (dVar21 * dVar4 + dVar22 * dVar5) + dVar20) break;
      pdVar23 = (pointer)((double)pdVar23 * dVar2);
      if ((this->super_optimizer).verbose != 0) {
        std::operator<<((ostream *)&std::cout,"Dec Alpha to: ");
        poVar16 = std::ostream::_M_insert<double>(this->alpha);
        std::endl<char,std::char_traits<char>>(poVar16);
      }
    }
    pdVar8 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pdVar8 = *delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start * (double)pdVar23 + *pdVar8;
    pdVar8[1] = delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[1] * (double)pdVar23 + pdVar8[1];
    if ((this->super_optimizer).verbose != 0) {
      std::operator<<((ostream *)&std::cout,"########### NEW SOLUTION ########### : (");
      poVar16 = std::ostream::_M_insert<double>
                          (*(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start);
      std::operator<<(poVar16,",");
      poVar16 = std::ostream::_M_insert<double>
                          ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[1]);
      poVar16 = std::operator<<(poVar16,")");
      std::endl<char,std::char_traits<char>>(poVar16);
      poVar16 = std::ostream::_M_insert<double>
                          (*(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start);
      std::operator<<(poVar16," ");
      poVar16 = std::ostream::_M_insert<double>
                          ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[1]);
      std::operator<<(poVar16," ");
      p_Var6 = this->f;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_120,pvVar1);
      vVar15.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar23;
      vVar15.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)in_stack_fffffffffffffe38._0_8_;
      vVar15.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffe38._8_8_;
      dVar18 = (*p_Var6)(vVar15);
      poVar16 = std::ostream::_M_insert<double>(dVar18);
      std::endl<char,std::char_traits<char>>(poVar16);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_120);
    }
    pdVar23 = (pointer)((double)pdVar23 * dVar3);
    uVar17 = uVar17 + (SQRT((double)pdVar23 *
                            delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[1] *
                            (double)pdVar23 *
                            delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[1] +
                            (double)pdVar23 *
                            *delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start *
                            (double)pdVar23 *
                            *delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) < this->tol);
  }
  std::ofstream::close();
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,pvVar1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&delta.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

vector<double> backtrackingLineSearch::optimize(){
    uint count=0;
    //local variable for that optimization problem
    double alpha_=alpha;
    double alpha_dec_=alpha_dec;
    double alpha_inc_=alpha_inc;
    vector<double> delta;
    if (verbose!=0){
        cout << "Initial SOLUTION : ("<< x[0] << ","<< x[1]<<")"<<endl;
        logFile<<x[0]<<" "<<x[1]<<" "<<f(x)<<endl;
    }
    while (count<10){
        delta=utils::Delta(df(x));
        while (f({x[0]+alpha_*delta[0],x[1]+alpha_*delta[1]})>f(x)+wolfe_para*(df(x)[0]*alpha_*delta[0]+df(x)[1]*alpha_*delta[1])){
            alpha_*=alpha_dec_;
            if(verbose!=0) cout<<"Dec Alpha to: "<<alpha<<endl;
        }
        x[0]+=alpha_*delta[0];
        x[1]+=alpha_*delta[1];
        alpha_*=alpha_inc_;
        if (verbose!=0){
            cout << "########### NEW SOLUTION ########### : ("<< x[0] << ","<< x[1]<<")"<<endl;
            logFile<<x[0]<<" "<<x[1]<<" "<<f(x)<<endl;
        }
        // terminaltion rule for the inner loop
        if(sqrt(pow(alpha_*delta[0],2)+pow(alpha_*delta[1],2))<tol)count++;
        }
    logFile.close();
    return x;
}